

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O0

void project(OSQPWorkspace *work,c_float *z)

{
  double *pdVar1;
  long lVar2;
  c_float local_38;
  c_float local_30;
  double local_28;
  c_int m;
  c_int i;
  c_float *z_local;
  OSQPWorkspace *work_local;
  
  lVar2 = work->data->m;
  for (i = 0; i < lVar2; i = i + 1) {
    pdVar1 = work->data->l + i;
    if (z[i] < *pdVar1 || z[i] == *pdVar1) {
      local_28 = work->data->l[i];
    }
    else {
      local_28 = z[i];
    }
    if (work->data->u[i] <= local_28) {
      local_38 = work->data->u[i];
    }
    else {
      pdVar1 = work->data->l + i;
      if (z[i] < *pdVar1 || z[i] == *pdVar1) {
        local_30 = work->data->l[i];
      }
      else {
        local_30 = z[i];
      }
      local_38 = local_30;
    }
    z[i] = local_38;
  }
  return;
}

Assistant:

void project(OSQPWorkspace *work, c_float *z) {
  c_int i, m;

  m = work->data->m;

  for (i = 0; i < m; i++) {
    z[i] = c_min(c_max(z[i],
                       work->data->l[i]), // Between lower
                 work->data->u[i]);       // and upper bounds
  }
}